

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O2

OPJ_BOOL opj_j2k_read_cod(opj_j2k_t *p_j2k,OPJ_BYTE *p_header_data,OPJ_UINT32 p_header_size,
                         opj_event_mgr_t *p_manager)

{
  OPJ_UINT32 OVar1;
  opj_image_t *poVar2;
  opj_tccp_t *poVar3;
  undefined8 uVar4;
  OPJ_BOOL OVar5;
  opj_tcp_t *poVar6;
  OPJ_UINT32 OVar7;
  long lVar8;
  char *fmt;
  OPJ_UINT32 *pOVar9;
  ulong __n;
  uint uVar10;
  OPJ_UINT32 p_header_size_local;
  OPJ_UINT32 *local_40;
  OPJ_UINT32 l_tmp;
  
  p_header_size_local = p_header_size;
  if (p_header_data == (OPJ_BYTE *)0x0) {
    __assert_fail("p_header_data != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0xa49,
                  "OPJ_BOOL opj_j2k_read_cod(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if (p_j2k == (opj_j2k_t *)0x0) {
    __assert_fail("p_j2k != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0xa4a,
                  "OPJ_BOOL opj_j2k_read_cod(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if (p_manager == (opj_event_mgr_t *)0x0) {
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0xa4b,
                  "OPJ_BOOL opj_j2k_read_cod(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if ((p_j2k->m_specific_param).m_decoder.m_state == 0x10) {
    poVar6 = (p_j2k->m_cp).tcps + p_j2k->m_current_tile_number;
  }
  else {
    poVar6 = (p_j2k->m_specific_param).m_decoder.m_default_tcp;
  }
  poVar2 = p_j2k->m_private_image;
  poVar6->field_0x1638 = poVar6->field_0x1638 | 1;
  if (4 < p_header_size) {
    opj_read_bytes_LE(p_header_data,&poVar6->csty,1);
    if (7 < poVar6->csty) {
      fmt = "Unknown Scod value in COD marker\n";
      goto LAB_00114869;
    }
    opj_read_bytes_LE(p_header_data + 1,&l_tmp,1);
    poVar6->prg = l_tmp;
    if (4 < (int)l_tmp) {
      opj_event_msg(p_manager,1,"Unknown progression order in COD marker\n");
      poVar6->prg = OPJ_PROG_UNKNOWN;
    }
    opj_read_bytes_LE(p_header_data + 2,&poVar6->numlayers,2);
    if (poVar6->numlayers - 0x10000 < 0xffff0001) {
      opj_event_msg(p_manager,1,
                    "Invalid number of layers in COD marker : %d not in range [1-65535]\n");
      return 0;
    }
    OVar1 = (p_j2k->m_cp).m_specific_param.m_dec.m_layer;
    OVar7 = poVar6->numlayers;
    if (OVar1 != 0) {
      OVar7 = OVar1;
    }
    poVar6->num_layers_to_decode = OVar7;
    opj_read_bytes_LE(p_header_data + 4,&poVar6->mct,1);
    p_header_size_local = p_header_size_local - 5;
    uVar10 = poVar2->numcomps;
    for (lVar8 = 0; (ulong)uVar10 * 0x438 - lVar8 != 0; lVar8 = lVar8 + 0x438) {
      *(OPJ_UINT32 *)((long)poVar6->tccps->stepsizes + lVar8 + -0x1c) = poVar6->csty & 1;
    }
    OVar5 = opj_j2k_read_SPCod_SPCoc(p_j2k,0,p_header_data + 5,&p_header_size_local,p_manager);
    if (OVar5 == 0) {
      fmt = "Error reading COD marker\n";
      goto LAB_00114869;
    }
    if (p_header_size_local == 0) {
      if ((p_j2k->m_specific_param).m_decoder.m_state == 0x10) {
        poVar6 = (p_j2k->m_cp).tcps + p_j2k->m_current_tile_number;
      }
      else {
        poVar6 = (p_j2k->m_specific_param).m_decoder.m_default_tcp;
      }
      poVar3 = poVar6->tccps;
      __n = (ulong)(poVar3->numresolutions << 2);
      local_40 = poVar3->prcw;
      pOVar9 = &poVar3[1].numresolutions;
      for (uVar10 = 1; uVar10 < p_j2k->m_private_image->numcomps; uVar10 = uVar10 + 1) {
        uVar4 = *(undefined8 *)&poVar3->cblkh;
        *(undefined8 *)pOVar9 = *(undefined8 *)&poVar3->numresolutions;
        *(undefined8 *)(pOVar9 + 2) = uVar4;
        pOVar9[4] = poVar3->qmfbid;
        memcpy(pOVar9 + 0xca,local_40,__n);
        memcpy(pOVar9 + 0xeb,poVar3->prch,__n);
        pOVar9 = pOVar9 + 0x10e;
      }
      return 1;
    }
  }
  fmt = "Error reading COD marker\n";
LAB_00114869:
  opj_event_msg(p_manager,1,fmt);
  return 0;
}

Assistant:

static OPJ_BOOL opj_j2k_read_cod(opj_j2k_t *p_j2k,
                                 OPJ_BYTE * p_header_data,
                                 OPJ_UINT32 p_header_size,
                                 opj_event_mgr_t * p_manager
                                )
{
    /* loop */
    OPJ_UINT32 i;
    OPJ_UINT32 l_tmp;
    opj_cp_t *l_cp = 00;
    opj_tcp_t *l_tcp = 00;
    opj_image_t *l_image = 00;

    /* preconditions */
    assert(p_header_data != 00);
    assert(p_j2k != 00);
    assert(p_manager != 00);

    l_image = p_j2k->m_private_image;
    l_cp = &(p_j2k->m_cp);

    /* If we are in the first tile-part header of the current tile */
    l_tcp = (p_j2k->m_specific_param.m_decoder.m_state == J2K_STATE_TPH) ?
            &l_cp->tcps[p_j2k->m_current_tile_number] :
            p_j2k->m_specific_param.m_decoder.m_default_tcp;

#if 0
    /* This check was added per https://github.com/uclouvain/openjpeg/commit/daed8cc9195555e101ab708a501af2dfe6d5e001 */
    /* but this is no longer necessary to handle issue476.jp2 */
    /* and this actually cause issues on legit files. See https://github.com/uclouvain/openjpeg/issues/1043 */
    /* Only one COD per tile */
    if (l_tcp->cod) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "COD marker already read. No more than one COD marker per tile.\n");
        return OPJ_FALSE;
    }
#endif
    l_tcp->cod = 1;

    /* Make sure room is sufficient */
    if (p_header_size < 5) {
        opj_event_msg(p_manager, EVT_ERROR, "Error reading COD marker\n");
        return OPJ_FALSE;
    }

    opj_read_bytes(p_header_data, &l_tcp->csty, 1);         /* Scod */
    ++p_header_data;
    /* Make sure we know how to decode this */
    if ((l_tcp->csty & ~(OPJ_UINT32)(J2K_CP_CSTY_PRT | J2K_CP_CSTY_SOP |
                                     J2K_CP_CSTY_EPH)) != 0U) {
        opj_event_msg(p_manager, EVT_ERROR, "Unknown Scod value in COD marker\n");
        return OPJ_FALSE;
    }
    opj_read_bytes(p_header_data, &l_tmp, 1);                       /* SGcod (A) */
    ++p_header_data;
    l_tcp->prg = (OPJ_PROG_ORDER) l_tmp;
    /* Make sure progression order is valid */
    if (l_tcp->prg > OPJ_CPRL) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Unknown progression order in COD marker\n");
        l_tcp->prg = OPJ_PROG_UNKNOWN;
    }
    opj_read_bytes(p_header_data, &l_tcp->numlayers, 2);    /* SGcod (B) */
    p_header_data += 2;

    if ((l_tcp->numlayers < 1U) || (l_tcp->numlayers > 65535U)) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Invalid number of layers in COD marker : %d not in range [1-65535]\n",
                      l_tcp->numlayers);
        return OPJ_FALSE;
    }

    /* If user didn't set a number layer to decode take the max specify in the codestream. */
    if (l_cp->m_specific_param.m_dec.m_layer) {
        l_tcp->num_layers_to_decode = l_cp->m_specific_param.m_dec.m_layer;
    } else {
        l_tcp->num_layers_to_decode = l_tcp->numlayers;
    }

    opj_read_bytes(p_header_data, &l_tcp->mct, 1);          /* SGcod (C) */
    ++p_header_data;

    p_header_size -= 5;
    for (i = 0; i < l_image->numcomps; ++i) {
        l_tcp->tccps[i].csty = l_tcp->csty & J2K_CCP_CSTY_PRT;
    }

    if (! opj_j2k_read_SPCod_SPCoc(p_j2k, 0, p_header_data, &p_header_size,
                                   p_manager)) {
        opj_event_msg(p_manager, EVT_ERROR, "Error reading COD marker\n");
        return OPJ_FALSE;
    }

    if (p_header_size != 0) {
        opj_event_msg(p_manager, EVT_ERROR, "Error reading COD marker\n");
        return OPJ_FALSE;
    }

    /* Apply the coding style to other components of the current tile or the m_default_tcp*/
    opj_j2k_copy_tile_component_parameters(p_j2k);

    /* Index */
#ifdef WIP_REMOVE_MSD
    if (p_j2k->cstr_info) {
        /*opj_codestream_info_t *l_cstr_info = p_j2k->cstr_info;*/
        p_j2k->cstr_info->prog = l_tcp->prg;
        p_j2k->cstr_info->numlayers = l_tcp->numlayers;
        p_j2k->cstr_info->numdecompos = (OPJ_INT32*) opj_malloc(
                                            l_image->numcomps * sizeof(OPJ_UINT32));
        if (!p_j2k->cstr_info->numdecompos) {
            return OPJ_FALSE;
        }
        for (i = 0; i < l_image->numcomps; ++i) {
            p_j2k->cstr_info->numdecompos[i] = l_tcp->tccps[i].numresolutions - 1;
        }
    }
#endif

    return OPJ_TRUE;
}